

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

BOOL MAPUnmapPEFile(LPCVOID lpAddress)

{
  _LIST_ENTRY *p_Var1;
  _LIST_ENTRY *p_Var2;
  _LIST_ENTRY *p_Var3;
  int iVar4;
  CPalThread *pThread_00;
  IPalObject *pFileObject;
  PMAPPED_VIEW_LIST pView_1;
  PLIST_ENTRY _EX_Flink;
  PLIST_ENTRY _EX_Blink;
  PMAPPED_VIEW_LIST pView;
  PLIST_ENTRY p_Stack_40;
  uint nPESections;
  PLIST_ENTRY pLinkLocal;
  PLIST_ENTRY pLinkNext;
  PLIST_ENTRY pLink;
  CPalThread *pThread;
  BOOL retval;
  LPCVOID lpAddress_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (lpAddress == (LPCVOID)0x0) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    lpAddress_local._4_4_ = 0;
  }
  else {
    pThread._4_4_ = 1;
    pThread_00 = CorUnix::InternalGetCurrentThread();
    CorUnix::InternalEnterCriticalSection(pThread_00,&mapping_critsec);
    p_Stack_40 = (PLIST_ENTRY)0x0;
    pView._4_4_ = 0;
    pLinkNext = MappedViewList.Flink;
    p_Var1 = pLinkNext;
    while (pLinkNext = p_Var1, pLinkNext != &MappedViewList) {
      p_Var1 = pLinkNext->Flink;
      if (pLinkNext[3].Flink == (_LIST_ENTRY *)lpAddress) {
        pView._4_4_ = pView._4_4_ + 1;
        p_Var2 = pLinkNext->Flink;
        p_Var3 = pLinkNext->Blink;
        p_Var3->Flink = p_Var2;
        p_Var2->Blink = p_Var3;
        pLinkNext->Flink = p_Stack_40;
        p_Stack_40 = pLinkNext;
      }
    }
    if ((pView._4_4_ == 0) && ((PAL_InitializeChakraCoreCalled & 1U) == 0)) {
      abort();
    }
    CorUnix::InternalLeaveCriticalSection(pThread_00,&mapping_critsec);
    pLinkNext = p_Stack_40;
    while (pLinkNext != (PLIST_ENTRY)0x0) {
      p_Var1 = pLinkNext->Flink;
      iVar4 = munmap(pLinkNext[1].Blink,(size_t)pLinkNext[2].Flink);
      if (iVar4 == -1) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        pThread._4_4_ = 0;
      }
      p_Var2 = pLinkNext[1].Flink;
      if (p_Var2 != (_LIST_ENTRY *)0x0) {
        (*(code *)p_Var2->Flink[4].Flink)(p_Var2,pThread_00);
      }
      CorUnix::InternalFree(pLinkNext);
      pLinkNext = p_Var1;
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    lpAddress_local._4_4_ = pThread._4_4_;
  }
  return lpAddress_local._4_4_;
}

Assistant:

BOOL MAPUnmapPEFile(LPCVOID lpAddress)
{
    TRACE_(LOADER)("MAPUnmapPEFile(lpAddress=%p)\n", lpAddress);

    if ( NULL == lpAddress )
    {
        ERROR_(LOADER)( "lpAddress cannot be NULL\n" );
        return FALSE;
    }

    BOOL retval = TRUE;
    CPalThread * pThread = InternalGetCurrentThread();
    InternalEnterCriticalSection(pThread, &mapping_critsec);
    PLIST_ENTRY pLink, pLinkNext, pLinkLocal = NULL;
    unsigned nPESections = 0;

    // Look through the entire MappedViewList for all mappings associated with the
    // PE file with base address 'lpAddress'. We want to unmap all the memory
    // and then release the file mapping object. Unfortunately, based on the comment
    // in CorUnix::InternalUnmapViewOfFile(), we can't release the file mapping object
    // while within the mapping critical section. So, we unlink all the elements from the
    // main list while in the critical section, and then run through this local list
    // doing the real work after releasing the main list critical section. The order
    // of the unmapping doesn't matter, so we don't fully set all the list link pointers,
    // only a minimal set.

    for(pLink = MappedViewList.Flink;
        pLink != &MappedViewList;
        pLink = pLinkNext)
    {
        pLinkNext = pLink->Flink;
        PMAPPED_VIEW_LIST pView = CONTAINING_RECORD(pLink, MAPPED_VIEW_LIST, Link);

        if (pView->lpPEBaseAddress == lpAddress) // this entry is associated with the PE file
        {
            ++nPESections; // for debugging, check that we see at least one

            RemoveEntryList(&pView->Link);
            pView->Link.Flink = pLinkLocal; // the local list is singly-linked, NULL terminated
            pLinkLocal = &pView->Link;
        }
    }

#if _DEBUG
    if (nPESections == 0)
    {
        ERROR_(LOADER)( "MAPUnmapPEFile called to unmap a file that was not in the PE file mapping list\n" );
    }
#endif // _DEBUG

    InternalLeaveCriticalSection(pThread, &mapping_critsec);

    // Now, outside the critical section, do the actual unmapping work

    for(pLink = pLinkLocal;
        pLink != NULL;
        pLink = pLinkNext)
    {
        pLinkNext = pLink->Flink;
        PMAPPED_VIEW_LIST pView = CONTAINING_RECORD(pLink, MAPPED_VIEW_LIST, Link);

        // remove pView mapping from the list
        if (-1 == munmap(pView->lpAddress, pView->NumberOfBytesToMap))
        {
            // Emit an error message in a trace, but continue trying to do the rest
            ERROR_(LOADER)("Unable to unmap the file. Expect trouble.\n");
            retval = FALSE;
        }

        IPalObject* pFileObject = pView->pFileMapping;
        if (NULL != pFileObject)
        {
            pFileObject->ReleaseReference(pThread);
        }
        InternalFree(pView); // this leaves pLink dangling
    }

    TRACE_(LOADER)("MAPUnmapPEFile returning %d\n", retval);
    return retval;
}